

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O2

void __thiscall DataFileTest::testWriteDouble(DataFileTest *this)

{
  size_t __n;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int iVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  DataFileWriter<Complex<double>_> df;
  double local_28;
  double dStack_20;
  
  __n = 100;
  avro::DataFileWriter<Complex<double>_>::DataFileWriter
            (&df,this->filename,&this->writerSchema,100,NULL_CODEC);
  dVar3 = 3.0;
  dVar4 = 5.0;
  iVar1 = 1000;
  __buf = extraout_RDX;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    local_28 = dVar3;
    dStack_20 = dVar4;
    avro::DataFileWriter<Complex<double>_>::write(&df,(int)&local_28,__buf,__n);
    dVar3 = dVar3 + dVar4 + -0.7;
    dVar4 = dVar4 + 3.1;
    __buf = extraout_RDX_00;
  }
  avro::DataFileWriterBase::close();
  std::auto_ptr<avro::DataFileWriterBase>::~auto_ptr(&df.base_);
  return;
}

Assistant:

void testWriteDouble() {
        avro::DataFileWriter<ComplexDouble> df(filename, writerSchema, 100);
        double re = 3.0;
        double im = 5.0;
        for (int i = 0; i < count; ++i, re += im - 0.7, im += 3.1) {
            ComplexDouble c(re, im);
            df.write(c);
        }
        df.close();
    }